

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfloat.c
# Opt level: O0

int mpt_cfloat(float *val,char *src,float *range)

{
  char cVar1;
  ushort **ppuVar2;
  float *local_38;
  char *end;
  float *pfStack_28;
  float tmp;
  float *range_local;
  char *src_local;
  float *val_local;
  
  if (src == (char *)0x0) {
    val_local._4_4_ = -1;
  }
  else if (*src == '\0') {
    val_local._4_4_ = 0;
  }
  else {
    pfStack_28 = range;
    range_local = (float *)src;
    src_local = (char *)val;
    end._4_4_ = strtof(src,(char **)&local_38);
    if (local_38 == range_local) {
      do {
        if (*(char *)range_local == '\0') {
          return 0;
        }
        ppuVar2 = __ctype_b_loc();
        cVar1 = *(char *)range_local;
        range_local = (float *)((long)range_local + 1);
      } while (((*ppuVar2)[(int)cVar1] & 0x2000) != 0);
      val_local._4_4_ = -3;
    }
    else if ((pfStack_28 == (float *)0x0) ||
            ((*pfStack_28 <= end._4_4_ && (end._4_4_ < pfStack_28[1] || end._4_4_ == pfStack_28[1]))
            )) {
      if (src_local != (char *)0x0) {
        *(float *)src_local = end._4_4_;
      }
      val_local._4_4_ = (int)local_38 - (int)range_local;
    }
    else {
      val_local._4_4_ = -2;
    }
  }
  return val_local._4_4_;
}

Assistant:

extern int mpt_cfloat(float *val, const char *src, const float range[2])
{
#if _XOPEN_SOURCE >= 600 || _ISOC99_SOURCE || _POSIX_C_SOURCE >= 200112L
	float tmp;
	char *end;
	
	if (!src) {
		return MPT_ERROR(BadArgument);
	}
	if (!*src) {
		return 0;
	}
	tmp = strtof(src, &end);
	
	if (end == src) {
		/* accept space as empty string */
		while (*src) {
			if (!isspace(*src++)) {
				return MPT_ERROR(BadType);
			}
		}
		return 0;
	}
	if (range && (range[0] > tmp || tmp > range[1])) {
		return MPT_ERROR(BadValue);
	}
	if (val) {
		*val = tmp;
	}
	return end - src;
#else
	double tmp, rf[2] = { 0, 0 };
	int ret;
	
	if (range) {
		rf[0] = range[0];
		rf[1] = range[1];
	}
	
	if ((ret = mpt_cdouble(&tmp, src, range ? rf : 0)) > 0 && val) {
		*val = tmp;
	}
	return ret;
#endif
}